

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend_openssl.cpp
# Opt level: O1

void q_loadCiphersForConnection
               (SSL *connection,QList<QSslCipher> *ciphers,QList<QSslCipher> *defaultCiphers)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  stack_st_SSL_CIPHER *a;
  SSL_CIPHER *cipher;
  long in_FS_OFFSET;
  QLatin1String QVar7;
  QLatin1String QVar8;
  QLatin1String QVar9;
  QSslCipher ciph;
  QArrayData *local_d0;
  QString local_b8;
  QArrayData *local_a0;
  QString local_88;
  QArrayData *local_70;
  QString local_58;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  a = q_SSL_get_ciphers(connection);
  iVar5 = q_OPENSSL_sk_num((OPENSSL_STACK *)a);
  if (0 < iVar5) {
    iVar5 = 0;
    do {
      cipher = (SSL_CIPHER *)q_OPENSSL_sk_value((OPENSSL_STACK *)a,iVar5);
      if (cipher != (SSL_CIPHER *)0x0) {
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        QTlsBackendOpenSSL::qt_OpenSSL_cipher_to_QSslCipher((QTlsBackendOpenSSL *)&local_40,cipher);
        cVar2 = QSslCipher::isNull();
        if (cVar2 == '\0') {
          QSslCipher::name();
          QString::toLower_helper(&local_58);
          QVar7.m_data = (char *)0x3;
          QVar7.m_size = (qsizetype)&local_58;
          cVar2 = QString::startsWith(QVar7,0x13c57b);
          if (cVar2 == '\0') {
            QSslCipher::name();
            QString::toLower_helper(&local_88);
            QVar8.m_data = (char *)0x7;
            QVar8.m_size = (qsizetype)&local_88;
            cVar3 = QString::startsWith(QVar8,0x13c577);
            if (cVar3 != '\0') goto LAB_0011751f;
            QSslCipher::name();
            QString::toLower_helper(&local_b8);
            QVar9.m_data = (char *)0x5;
            QVar9.m_size = (qsizetype)&local_b8;
            bVar4 = QString::startsWith(QVar9,0x13c57f);
            bVar4 = bVar4 ^ 1;
            bVar1 = true;
          }
          else {
LAB_0011751f:
            bVar1 = false;
            bVar4 = 0;
          }
          if (bVar1) {
            if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (local_d0 != (QArrayData *)0x0) {
              LOCK();
              (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_d0,2,0x10);
              }
            }
          }
          if (cVar2 == '\0') {
            if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (local_a0 != (QArrayData *)0x0) {
              LOCK();
              (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_a0,2,0x10);
              }
            }
          }
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_70 != (QArrayData *)0x0) {
            LOCK();
            (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_70,2,0x10);
            }
          }
          if (bVar4 != 0) {
            QtPrivate::QMovableArrayOps<QSslCipher>::emplace<QSslCipher_const&>
                      ((QMovableArrayOps<QSslCipher> *)ciphers,(ciphers->d).size,
                       (QSslCipher *)&local_40);
            QList<QSslCipher>::end(ciphers);
            iVar6 = QSslCipher::usedBits();
            if (0x7f < iVar6) {
              QtPrivate::QMovableArrayOps<QSslCipher>::emplace<QSslCipher_const&>
                        ((QMovableArrayOps<QSslCipher> *)defaultCiphers,(defaultCiphers->d).size,
                         (QSslCipher *)&local_40);
              QList<QSslCipher>::end(defaultCiphers);
            }
          }
        }
        QSslCipher::~QSslCipher((QSslCipher *)&local_40);
      }
      iVar5 = iVar5 + 1;
      iVar6 = q_OPENSSL_sk_num((OPENSSL_STACK *)a);
    } while (iVar5 < iVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void q_loadCiphersForConnection(SSL *connection, QList<QSslCipher> &ciphers,
                                       QList<QSslCipher> &defaultCiphers)
{
    Q_ASSERT(connection);

    STACK_OF(SSL_CIPHER) *supportedCiphers = q_SSL_get_ciphers(connection);
    for (int i = 0; i < q_sk_SSL_CIPHER_num(supportedCiphers); ++i) {
        if (SSL_CIPHER *cipher = q_sk_SSL_CIPHER_value(supportedCiphers, i)) {
            const auto ciph = QTlsBackendOpenSSL::qt_OpenSSL_cipher_to_QSslCipher(cipher);
            if (!ciph.isNull()) {
                // Unconditionally exclude ADH and AECDH ciphers since they offer no MITM protection
                if (!ciph.name().toLower().startsWith("adh"_L1) &&
                    !ciph.name().toLower().startsWith("exp-adh"_L1) &&
                    !ciph.name().toLower().startsWith("aecdh"_L1)) {
                    ciphers << ciph;

                    if (ciph.usedBits() >= 128)
                        defaultCiphers << ciph;
                }
            }
        }
    }
}